

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBLookupTables.cpp
# Opt level: O1

char * GetUSBClassName(U8 classCode)

{
  IdNamePair *pIVar1;
  difference_type __d;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 in_register_00000039;
  
  pIVar1 = ClassCodes;
  uVar4 = 0x14;
  do {
    uVar2 = uVar4 >> 1;
    uVar3 = uVar2;
    if (pIVar1[uVar2].id < CONCAT11(in_register_00000039,classCode)) {
      uVar3 = ~uVar2 + uVar4;
      pIVar1 = pIVar1 + uVar2 + 1;
    }
    uVar4 = uVar3;
  } while (0 < (long)uVar3);
  if ((pIVar1->id == CONCAT11(in_register_00000039,classCode)) && (pIVar1->name != (char *)0x0)) {
    return pIVar1->name;
  }
  return "<unknown>";
}

Assistant:

const char* GetUSBClassName( U8 classCode )
{
    const size_t NUM_ITEMS = sizeof( ClassCodes ) / sizeof( IdNamePair );

    IdNamePair srch;
    srch.id = classCode;

    const IdNamePair* res = std::lower_bound( ClassCodes, ClassCodes + NUM_ITEMS, srch );

    if( res->id == classCode && res->name != NULL )
        return res->name;

    return "<unknown>";
}